

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
                 (UnknownFieldSet *unknown_fields)

{
  pointer pUVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  
  pUVar1 = (unknown_fields->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(unknown_fields->fields_).
                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 4;
  uVar6 = 0;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  sVar9 = 0;
  for (; uVar5 * 0x10 != uVar6; uVar6 = uVar6 + 0x10) {
    if (*(int *)((long)&pUVar1->type_ + uVar6) == 3) {
      uVar7 = *(uint *)((long)&pUVar1->number_ + uVar6) | 1;
      iVar2 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar7 = (uint)*(undefined8 *)(*(long *)((long)&pUVar1->data_ + uVar6) + 8);
      uVar8 = uVar7 | 1;
      iVar3 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar9 = (long)(int)uVar7 + sVar9 + 4 + (ulong)(iVar2 * 9 + 0x49U >> 6) +
              (ulong)(iVar3 * 9 + 0x49U >> 6);
    }
  }
  return sVar9;
}

Assistant:

size_t WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}